

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringAnisotropyTests.cpp
# Opt level: O0

void __thiscall
vkt::texture::anon_unknown_0::FilteringAnisotropyInstance::~FilteringAnisotropyInstance
          (FilteringAnisotropyInstance *this)

{
  FilteringAnisotropyInstance *this_local;
  
  ~FilteringAnisotropyInstance(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

FilteringAnisotropyInstance	(Context& context, const AnisotropyParams& refParams)
		: vkt::TestInstance	(context)
		, m_refParams		(refParams)
	{
		// Sampling parameters.
		m_refParams.sampler			= util::createSampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, m_refParams.minFilter, m_refParams.magFilter);
		m_refParams.samplerType		= getSamplerType(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		m_refParams.flags			= 0u;
		m_refParams.lodMode			= LODMODE_EXACT;
		m_refParams.maxAnisotropy	= min(getPhysicalDeviceProperties(m_context.getInstanceInterface(), m_context.getPhysicalDevice()).limits.maxSamplerAnisotropy, m_refParams.maxAnisotropy);

		if (m_refParams.mipMap)
		{
			m_refParams.maxLevel	= deLog2Floor32(ANISOTROPY_TEST_RESOLUTION);
			m_refParams.minLod		= 0.0f;
			m_refParams.maxLod		= static_cast<float>(m_refParams.maxLevel);
		}
		else
			m_refParams.maxLevel	= 0;
	}